

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O0

void __thiscall
Centaurus::ATNNode<char>::ATNNode
          (ATNNode<char> *this,ATNNode<char> *old,
          vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
          *transitions)

{
  vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
  *transitions_local;
  ATNNode<char> *old_local;
  ATNNode<char> *this_local;
  
  this->_vptr_ATNNode = (_func_int **)&PTR__ATNNode_00289ce8;
  std::vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>::
  vector(&this->m_transitions,transitions);
  this->m_type = old->m_type;
  Identifier::Identifier(&this->m_invoke,&old->m_invoke);
  NFA<char>::NFA(&this->m_nfa,&old->m_nfa);
  std::__cxx11::string::string((string *)&this->m_literal,(string *)&old->m_literal);
  this->m_localid = old->m_localid;
  return;
}

Assistant:

ATNNode(const ATNNode<TCHAR>& old, std::vector<ATNTransition<TCHAR> >&& transitions)
        : m_transitions(transitions), m_type(old.m_type), m_invoke(old.m_invoke), m_nfa(old.m_nfa), m_literal(old.m_literal), m_localid(old.m_localid)
    {
    }